

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterSparseCoDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  int iVar1;
  int iVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  pointer pnVar4;
  pointer pnVar5;
  int *piVar6;
  type_conflict5 tVar7;
  ulong uVar8;
  DataKey DVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  pointer pnVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  devexpr *pdVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  byte bVar18;
  int local_2f4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  devexpr local_b0 [112];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  bVar18 = 0;
  pSVar3 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar4 = (pSVar3->theTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar5 = (pSVar3->weights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_2b8.m_backend.fpclass = cpp_dec_float_finite;
  local_2b8.m_backend.prec_elem = 0x1c;
  local_2b8.m_backend.data._M_elems[0] = 0;
  local_2b8.m_backend.data._M_elems[1] = 0;
  local_2b8.m_backend.data._M_elems[2] = 0;
  local_2b8.m_backend.data._M_elems[3] = 0;
  local_2b8.m_backend.data._M_elems[4] = 0;
  local_2b8.m_backend.data._M_elems[5] = 0;
  local_2b8.m_backend.data._M_elems[6] = 0;
  local_2b8.m_backend.data._M_elems[7] = 0;
  local_2b8.m_backend.data._M_elems[8] = 0;
  local_2b8.m_backend.data._M_elems[9] = 0;
  local_2b8.m_backend.data._M_elems[10] = 0;
  local_2b8.m_backend.data._M_elems[0xb] = 0;
  local_2b8.m_backend.data._M_elems[0xc] = 0;
  local_2b8.m_backend.data._M_elems[0xd] = 0;
  local_2b8.m_backend.data._M_elems[0xe] = 0;
  local_2b8.m_backend.data._M_elems[0xf] = 0;
  local_2b8.m_backend.data._M_elems[0x10] = 0;
  local_2b8.m_backend.data._M_elems[0x11] = 0;
  local_2b8.m_backend.data._M_elems[0x12] = 0;
  local_2b8.m_backend.data._M_elems[0x13] = 0;
  local_2b8.m_backend.data._M_elems[0x14] = 0;
  local_2b8.m_backend.data._M_elems[0x15] = 0;
  local_2b8.m_backend.data._M_elems[0x16] = 0;
  local_2b8.m_backend.data._M_elems[0x17] = 0;
  local_2b8.m_backend.data._M_elems[0x18] = 0;
  local_2b8.m_backend.data._M_elems[0x19] = 0;
  local_2b8.m_backend.data._M_elems._104_5_ = 0;
  local_2b8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_2b8.m_backend.exp = 0;
  local_2b8.m_backend.neg = false;
  uVar12 = (ulong)(uint)(pSVar3->infeasibilitiesCo).super_IdxSet.num;
  local_2f4 = -1;
LAB_0043dd39:
  uVar8 = uVar12 & 0xffffffff;
  do {
    uVar12 = uVar12 - 1;
    if ((int)uVar8 < 1) {
      if (local_2f4 < 0) {
        DVar9.info = 0;
        DVar9.idx = -1;
      }
      else {
        DVar9 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::id((this->
                              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).thesolver,local_2f4);
      }
      return (SPxId)DVar9;
    }
    iVar1 = (((this->
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver)->infeasibilitiesCo).super_IdxSet.idx[uVar12];
    lVar11 = 0x1c;
    pnVar13 = pnVar4 + iVar1;
    pnVar15 = &local_2b8;
    for (lVar10 = lVar11; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar15->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
      pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    local_2b8.m_backend.exp = pnVar4[iVar1].m_backend.exp;
    local_2b8.m_backend.neg = pnVar4[iVar1].m_backend.neg;
    local_2b8.m_backend.fpclass = pnVar4[iVar1].m_backend.fpclass;
    local_2b8.m_backend.prec_elem = pnVar4[iVar1].m_backend.prec_elem;
    pnVar15 = feastol;
    pnVar17 = &result;
    for (; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pnVar17->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + ((ulong)bVar18 * -2 + 1) * 4);
      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar17 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    result.m_backend.exp = (feastol->m_backend).exp;
    result.m_backend.neg = (feastol->m_backend).neg;
    result.m_backend.fpclass = (feastol->m_backend).fpclass;
    result.m_backend.prec_elem = (feastol->m_backend).prec_elem;
    if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
    {
      result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
    }
    tVar7 = boost::multiprecision::operator<(&local_2b8,&result);
    if (tVar7) {
      lVar11 = 0x1c;
      pnVar15 = &local_2b8;
      pdVar16 = local_b0;
      for (lVar10 = lVar11; lVar10 != 0; lVar10 = lVar10 + -1) {
        *(uint *)pdVar16 = (pnVar15->m_backend).data._M_elems[0];
        pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar15 + ((ulong)bVar18 * -2 + 1) * 4);
        pdVar16 = pdVar16 + (ulong)bVar18 * -8 + 4;
      }
      local_40 = local_2b8.m_backend.exp;
      local_3c = local_2b8.m_backend.neg;
      local_38 = local_2b8.m_backend.fpclass;
      iStack_34 = local_2b8.m_backend.prec_elem;
      pcVar14 = &pnVar5[iVar1].m_backend;
      pnVar15 = &local_130;
      for (lVar10 = lVar11; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar15->m_backend).data._M_elems[0] = (pcVar14->data)._M_elems[0];
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
        pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar15 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      local_130.m_backend.exp = pnVar5[iVar1].m_backend.exp;
      local_130.m_backend.neg = pnVar5[iVar1].m_backend.neg;
      local_130.m_backend.fpclass = pnVar5[iVar1].m_backend.fpclass;
      local_130.m_backend.prec_elem = pnVar5[iVar1].m_backend.prec_elem;
      pnVar15 = feastol;
      pnVar17 = &local_1b0;
      for (lVar10 = lVar11; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar17->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
        pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar15 + ((ulong)bVar18 * -2 + 1) * 4);
        pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar17 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      local_1b0.m_backend.exp = (feastol->m_backend).exp;
      local_1b0.m_backend.neg = (feastol->m_backend).neg;
      local_1b0.m_backend.fpclass = (feastol->m_backend).fpclass;
      local_1b0.m_backend.prec_elem = (feastol->m_backend).prec_elem;
      devexpr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&result,local_b0,&local_130,&local_1b0,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_b0);
      pnVar15 = &result;
      pnVar17 = &local_2b8;
      for (; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pnVar17->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
        pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar15 + ((ulong)bVar18 * -2 + 1) * 4);
        pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar17 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      local_2b8.m_backend.exp = result.m_backend.exp;
      local_2b8.m_backend.neg = result.m_backend.neg;
      local_2b8.m_backend.fpclass = result.m_backend.fpclass;
      local_2b8.m_backend.prec_elem = result.m_backend.prec_elem;
      tVar7 = boost::multiprecision::operator>(&local_2b8,best);
      if (tVar7) break;
    }
    else {
      pSVar3 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      piVar6 = (pSVar3->infeasibilitiesCo).super_IdxSet.idx;
      iVar2 = (pSVar3->infeasibilitiesCo).super_IdxSet.num;
      (pSVar3->infeasibilitiesCo).super_IdxSet.num = iVar2 + -1;
      piVar6[uVar12] = piVar6[(long)iVar2 + -1];
      (pSVar3->isInfeasibleCo).data[iVar1] = 0;
    }
    uVar8 = (ulong)((int)uVar8 - 1);
  } while( true );
  pnVar15 = &local_2b8;
  pnVar17 = best;
  for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
    (pnVar17->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
    pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar15 + ((ulong)bVar18 * -2 + 1) * 4);
    pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar17 + ((ulong)bVar18 * -2 + 1) * 4);
  }
  (best->m_backend).exp = local_2b8.m_backend.exp;
  (best->m_backend).neg = local_2b8.m_backend.neg;
  (best->m_backend).fpclass = local_2b8.m_backend.fpclass;
  (best->m_backend).prec_elem = local_2b8.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (&(this->last).m_backend,&pnVar5[iVar1].m_backend);
  local_2f4 = iVar1;
  goto LAB_0043dd39;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterSparseCoDim(R& best, R feastol)
{
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   int enterIdx = -1;
   int idx;
   R x;

   assert(this->thesolver->weights.dim() == this->thesolver->test().dim());

   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = test[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, pen[idx], feastol);

         if(x > best)
         {
            best = x;
            enterIdx = idx;
            last = pen[idx];
         }
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);

   return SPxId();
}